

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Version.cpp
# Opt level: O0

void __thiscall csm::Version::Version(Version *this,int major,int minor,int revision)

{
  Error *pEVar1;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  ErrorType local_80;
  undefined1 local_7a;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ErrorType local_20;
  int local_1c;
  int local_18;
  int revision_local;
  int minor_local;
  int major_local;
  Version *this_local;
  
  local_1c = revision;
  local_18 = minor;
  revision_local = major;
  _minor_local = this;
  memset(this,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector(&this->theVersions);
  if (revision_local < 0) {
    local_7a = 1;
    pEVar1 = (Error *)__cxa_allocate_exception(0x50);
    local_20 = BOUNDS;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Invalid major version number",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"csm::Version::Version",&local_79);
    Error::Error(pEVar1,&local_20,&local_40,&local_78);
    local_7a = 0;
    __cxa_throw(pEVar1,&Error::typeinfo,Error::~Error);
  }
  if (local_18 < 0) {
    pEVar1 = (Error *)__cxa_allocate_exception(0x50);
    local_80 = BOUNDS;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"Invalid minor version number",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"csm::Version::Version",&local_c9);
    Error::Error(pEVar1,&local_80,&local_a0,&local_c8);
    __cxa_throw(pEVar1,&Error::typeinfo,Error::~Error);
  }
  std::vector<int,_std::allocator<int>_>::push_back(&this->theVersions,&revision_local);
  std::vector<int,_std::allocator<int>_>::push_back(&this->theVersions,&local_18);
  if (-1 < local_1c) {
    std::vector<int,_std::allocator<int>_>::push_back(&this->theVersions,&local_1c);
  }
  return;
}

Assistant:

Version::Version(int major, int minor, int revision)
   :
      theVersions()
{
   static const char* const MODULE = "csm::Version::Version";

   if (major < 0)
   {
      throw Error(Error::BOUNDS, "Invalid major version number", MODULE);
   }
   if (minor < 0)
   {
      throw Error(Error::BOUNDS, "Invalid minor version number", MODULE);
   }

   theVersions.push_back(major);
   theVersions.push_back(minor);
   if (revision >= 0) theVersions.push_back(revision);
}